

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnInitExprI32ConstExpr
          (BinaryReaderIR *this,Index index,uint32_t value)

{
  intrusive_list<wabt::Expr> *this_00;
  Const local_98;
  unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> local_50;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_48;
  undefined1 local_40 [8];
  Location loc;
  uint32_t value_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  loc.field_1.field_0.last_column = value;
  loc.field_1._12_4_ = index;
  GetLocation((Location *)local_40,this);
  this_00 = this->current_init_expr_;
  Const::I32(&local_98,loc.field_1.field_0.last_column,(Location *)local_40);
  MakeUnique<wabt::ConstExpr,wabt::Const,wabt::Location&>
            ((wabt *)&local_50,&local_98,(Location *)local_40);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_48,&local_50);
  intrusive_list<wabt::Expr>::push_back(this_00,&local_48);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_48);
  std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr(&local_50);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnInitExprI32ConstExpr(Index index, uint32_t value) {
  Location loc = GetLocation();
  current_init_expr_->push_back(
      MakeUnique<ConstExpr>(Const::I32(value, loc), loc));
  return Result::Ok;
}